

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TypeReferenceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Type *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  TypeReferenceExpression *pTVar3;
  
  pTVar3 = (TypeReferenceExpression *)allocate(this,0x38,8);
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pTVar3->super_Expression).kind = TypeReference;
  (pTVar3->super_Expression).type.ptr = args;
  (pTVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pTVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pTVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pTVar3->super_Expression).sourceRange.endLoc = SVar2;
  pTVar3->targetType = args_1;
  return pTVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }